

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O0

ConsumeResult * __thiscall
binlog::Session::reconsumeMetadata<TestStream>(Session *this,TestStream *out)

{
  char *pcVar1;
  void *__buf;
  streamsize sVar2;
  size_t in_RCX;
  size_t __n;
  TestStream *in_RDX;
  long in_RSI;
  ConsumeResult *in_RDI;
  ConsumeResult *result;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ConsumeResult::ConsumeResult(in_RDI);
  pcVar1 = detail::RecoverableVectorOutputStream::data((RecoverableVectorOutputStream *)0x220243);
  __buf = (void *)detail::RecoverableVectorOutputStream::ssize
                            ((RecoverableVectorOutputStream *)0x220252);
  TestStream::write(in_RDX,(int)pcVar1,__buf,in_RCX);
  sVar2 = detail::RecoverableVectorOutputStream::ssize((RecoverableVectorOutputStream *)0x220274);
  __n = in_RDI->bytesConsumed + sVar2;
  in_RDI->bytesConsumed = __n;
  pcVar1 = detail::RecoverableVectorOutputStream::data((RecoverableVectorOutputStream *)0x22029d);
  TestStream::write(in_RDX,(int)pcVar1,*(void **)(in_RSI + 0x70),__n);
  in_RDI->bytesConsumed = *(long *)(in_RSI + 0x70) + in_RDI->bytesConsumed;
  *(size_t *)(in_RSI + 0x80) = in_RDI->bytesConsumed + *(long *)(in_RSI + 0x80);
  in_RDI->totalBytesConsumed = *(size_t *)(in_RSI + 0x80);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2202ef);
  return in_RDI;
}

Assistant:

Session::ConsumeResult Session::reconsumeMetadata(OutputStream& out)
{
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add clock sync
  out.write(_clockSync.data(), _clockSync.ssize());
  result.bytesConsumed += std::size_t(_clockSync.ssize());

  // add consumed sources
  out.write(_sources.data(), _sourcesConsumePos);
  result.bytesConsumed += std::size_t(_sourcesConsumePos);

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;
  return result;
}